

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

void __thiscall cmCustomCommandGenerator::FillEmulatorsWithArguments(cmCustomCommandGenerator *this)

{
  string_view arg;
  cmValue this_00;
  bool bVar1;
  uint uVar2;
  TargetType TVar3;
  cmMakefile *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  reference name;
  string *this_03;
  reference argsOut;
  allocator<char> local_81;
  string local_80;
  cmValue local_60;
  cmValue emulator_property;
  cmGeneratorTarget *target;
  string *argv0;
  uint c;
  allocator<char> local_31;
  string local_30;
  cmCustomCommandGenerator *local_10;
  cmCustomCommandGenerator *this_local;
  
  local_10 = this;
  this_01 = cmLocalGenerator::GetMakefile(this->LG);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_CROSSCOMPILING",&local_31);
  bVar1 = cmMakefile::IsOn(this_01,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    for (argv0._0_4_ = 0; uVar2 = GetNumberOfCommands(this), (uint)argv0 < uVar2;
        argv0._0_4_ = (uint)argv0 + 1) {
      this_02 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                           (&(this->CommandLines).
                             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                            ,(ulong)(uint)argv0)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      name = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](this_02,0);
      emulator_property.Value = (string *)cmLocalGenerator::FindGeneratorTargetToUse(this->LG,name);
      if ((((cmGeneratorTarget *)emulator_property.Value != (cmGeneratorTarget *)0x0) &&
          (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)emulator_property.Value),
          TVar3 == EXECUTABLE)) &&
         (bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)emulator_property.Value),
         this_00 = emulator_property, !bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"CROSSCOMPILING_EMULATOR",&local_81);
        local_60 = cmGeneratorTarget::GetProperty(this_00.Value,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator(&local_81);
        bVar1 = cmValue::operator_cast_to_bool(&local_60);
        if (bVar1) {
          this_03 = cmValue::operator*[abi_cxx11_(&local_60);
          arg = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_03);
          argsOut = std::
                    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator[](&this->EmulatorsWithArguments,(ulong)(uint)argv0);
          cmExpandList(arg,argsOut,false);
        }
      }
    }
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::FillEmulatorsWithArguments()
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return;
  }

  for (unsigned int c = 0; c < this->GetNumberOfCommands(); ++c) {
    std::string const& argv0 = this->CommandLines[c][0];
    cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
    if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
        !target->IsImported()) {

      cmValue emulator_property =
        target->GetProperty("CROSSCOMPILING_EMULATOR");
      if (!emulator_property) {
        continue;
      }

      cmExpandList(*emulator_property, this->EmulatorsWithArguments[c]);
    }
  }
}